

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment_two_pass.c
# Opt level: O2

void BrotliCompressFragmentTwoPassImpl12
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,uint32_t *command_buf,
               uint8_t *literal_buf,int *table,size_t *storage_ix,uint8_t *storage)

{
  size_t __n;
  long lVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  size_t input_size_00;
  long *plVar8;
  ulong uVar9;
  byte bVar10;
  ulong uVar11;
  char *pcVar12;
  long *__s1;
  long *plVar13;
  long lVar14;
  long *__src;
  long *__s2;
  int *__s2_00;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  uint *puVar19;
  ulong uVar20;
  size_t tail;
  long *input_00;
  bool bVar21;
  long lStackY_b0;
  int local_94;
  uint8_t *local_90;
  
  input_00 = (long *)input;
  while( true ) {
    if (input_size == 0) {
      if (is_last != 0) {
        uVar11 = *storage_ix;
        *(ulong *)(storage + (uVar11 >> 3)) = (ulong)storage[uVar11 >> 3] | 1L << ((byte)uVar11 & 7)
        ;
        uVar9 = uVar11 + 1;
        *storage_ix = uVar9;
        *(ulong *)(storage + (uVar9 >> 3)) = (ulong)storage[uVar9 >> 3] | 1L << ((byte)uVar9 & 7);
        *storage_ix = (ulong)((int)uVar11 + 9U & 0xfffffff8);
      }
      return;
    }
    input_size_00 = 0x20000;
    if (input_size < 0x20000) {
      input_size_00 = input_size;
    }
    plVar8 = (long *)(input_size_00 + (long)input_00);
    __src = input_00;
    puVar19 = command_buf;
    local_90 = literal_buf;
    if (0xf < input_size) break;
LAB_00123e61:
    if (plVar8 < __src) {
      __assert_fail("next_emit <= ip_end",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                    ,0x19f,
                    "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                   );
    }
    if (__src < plVar8) {
      uVar5 = (uint)((long)plVar8 - (long)__src);
      if (5 < uVar5) {
        if (uVar5 < 0x82) {
          uVar5 = uVar5 - 2;
          uVar3 = 0x1f;
          if (uVar5 != 0) {
            for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          bVar10 = (char)(uVar3 ^ 0xffffffe0) + 0x1f;
          uVar4 = uVar5 >> (bVar10 & 0x1f);
          uVar5 = (uVar5 - (uVar4 << (bVar10 & 0x1f))) * 0x100 |
                  uVar4 + (uVar3 ^ 0xffffffe0) * 2 + 0x40;
        }
        else if (uVar5 < 0x842) {
          uVar3 = 0x1f;
          if (uVar5 - 0x42 != 0) {
            for (; uVar5 - 0x42 >> uVar3 == 0; uVar3 = uVar3 - 1) {
            }
          }
          uVar5 = (((-1 << ((byte)uVar3 & 0x1f)) + uVar5 + -0x42) * 0x100 - (uVar3 ^ 0x1f)) + 0x29;
        }
        else {
          iVar7 = uVar5 * 0x100;
          if (uVar5 < 0x1842) {
            uVar5 = iVar7 - 0x841eb;
          }
          else if (uVar5 < 0x5842) {
            uVar5 = iVar7 - 0x1841ea;
          }
          else {
            uVar5 = iVar7 - 0x5841e9;
          }
        }
      }
      *puVar19 = uVar5;
      puVar19 = puVar19 + 1;
      uVar9 = (long)plVar8 - (long)__src & 0xffffffff;
      memcpy(local_90,__src,uVar9);
      local_90 = local_90 + uVar9;
    }
    iVar7 = ShouldCompress((uint8_t *)input_00,input_size_00,(long)local_90 - (long)literal_buf);
    if (iVar7 == 0) {
      BrotliStoreMetaBlockHeader(input_size_00,1,storage_ix,storage);
      uVar5 = (int)*storage_ix + 7;
      *storage_ix = (ulong)(uVar5 & 0xfffffff8);
      memcpy(storage + (uVar5 >> 3),input_00,input_size_00);
      uVar9 = input_size_00 * 8 + *storage_ix;
      *storage_ix = uVar9;
      storage[uVar9 >> 3] = '\0';
    }
    else {
      BrotliStoreMetaBlockHeader(input_size_00,0,storage_ix,storage);
      uVar9 = *storage_ix;
      uVar11 = uVar9 >> 3;
      *(ulong *)(storage + uVar11) = (ulong)storage[uVar11];
      *storage_ix = uVar9 + 0xd;
      StoreCommands(m,literal_buf,(long)local_90 - (long)literal_buf,command_buf,
                    (long)puVar19 - (long)command_buf >> 2,storage_ix,storage);
    }
    input_size = input_size - input_size_00;
    input_00 = plVar8;
  }
  uVar9 = input_size - 0x10;
  if (input_size_00 - 6 < input_size - 0x10) {
    uVar9 = input_size_00 - 6;
  }
  local_94 = -1;
LAB_001238ad:
  lVar14 = *(long *)((long)__src + 1);
  uVar11 = 0x20;
  __s1 = (long *)((long)__src + 1);
  do {
    uVar16 = (ulong)(lVar14 * 0x1e35a7bd0000) >> 0x34;
    lVar1 = *__s1;
    if (uVar16 != (ulong)(lVar1 * 0x1e35a7bd0000) >> 0x34) {
      __assert_fail("hash == Hash(ip, shift)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                    ,0x123,
                    "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                   );
    }
    plVar13 = (long *)((uVar11 >> 5) + (long)__s1);
    if ((long *)(uVar9 + (long)input_00) < plVar13) goto LAB_00123e61;
    lVar14 = *plVar13;
    iVar7 = (int)input;
    iVar6 = (int)__s1;
    if ((((*(int *)((long)__s1 + -(long)local_94) == (int)lVar1) &&
         (__s2 = (long *)(-(long)local_94 + (long)__s1),
         *(char *)((long)__s2 + 4) == (char)((ulong)lVar1 >> 0x20))) &&
        (*(char *)((long)__s2 + 5) == (char)((ulong)lVar1 >> 0x28))) && (0 < local_94)) {
      table[uVar16] = iVar6 - iVar7;
LAB_00123931:
      if ((long)__s1 - (long)__s2 < 0x3fff1) break;
    }
    else {
      if ((long)table[uVar16] < 0) {
        __assert_fail("candidate >= base_ip",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                      ,0x131,
                      "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                     );
      }
      __s2 = (long *)(input + table[uVar16]);
      if (__s1 <= __s2) {
        __assert_fail("candidate < ip",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                      ,0x132,
                      "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                     );
      }
      table[uVar16] = iVar6 - iVar7;
      if ((((int)*__s1 == (int)*__s2) && (*(char *)((long)__s1 + 4) == *(char *)((long)__s2 + 4)))
         && (*(char *)((long)__s1 + 5) == *(char *)((long)__s2 + 5))) goto LAB_00123931;
    }
    uVar11 = (ulong)((int)uVar11 + 1);
    __s1 = plVar13;
  } while( true );
  uVar20 = (long)plVar8 + (-6 - (long)__s1);
  uVar11 = uVar20 & 0xfffffffffffffff8;
  uVar16 = 0;
  lVar14 = 0;
LAB_001239ac:
  if (uVar20 >> 3 == uVar16) {
    uVar17 = (ulong)((uint)uVar20 & 7);
    pcVar12 = (char *)((long)__s1 + (6 - lVar14));
    for (; (bVar21 = uVar17 != 0, uVar17 = uVar17 - 1, uVar16 = uVar20, bVar21 &&
           (uVar16 = uVar11, *(char *)((long)__s2 + uVar11 + 6) == *pcVar12)); uVar11 = uVar11 + 1)
    {
      pcVar12 = pcVar12 + 1;
    }
  }
  else {
    uVar17 = *(ulong *)((long)__s1 + uVar16 * 8 + 6);
    uVar18 = *(ulong *)((long)__s2 + uVar16 * 8 + 6);
    if (uVar17 == uVar18) goto code_r0x001239c3;
    uVar18 = uVar18 ^ uVar17;
    uVar11 = 0;
    if (uVar18 != 0) {
      for (; (uVar18 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    uVar16 = (uVar11 >> 3 & 0x1fffffff) - lVar14;
  }
  __n = uVar16 + 6;
  iVar2 = bcmp(__s1,__s2,__n);
  if (iVar2 != 0) {
    __assert_fail("0 == memcmp(base, candidate, matched)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                  ,0x149,
                  "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                 );
  }
  uVar3 = iVar6 - (int)__src;
  uVar5 = uVar3;
  if (5 < uVar3) {
    if (uVar3 < 0x82) {
      uVar4 = uVar3 - 2;
      uVar5 = 0x1f;
      if (uVar4 != 0) {
        for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      bVar10 = (char)(uVar5 ^ 0xffffffe0) + 0x1f;
      uVar15 = uVar4 >> (bVar10 & 0x1f);
      uVar5 = (uVar4 - (uVar15 << (bVar10 & 0x1f))) * 0x100 |
              uVar15 + (uVar5 ^ 0xffffffe0) * 2 + 0x40;
    }
    else if (uVar3 < 0x842) {
      uVar5 = 0x1f;
      if (uVar3 - 0x42 != 0) {
        for (; uVar3 - 0x42 >> uVar5 == 0; uVar5 = uVar5 - 1) {
        }
      }
      uVar5 = (((-1 << ((byte)uVar5 & 0x1f)) + uVar3 + -0x42) * 0x100 - (uVar5 ^ 0x1f)) + 0x29;
    }
    else {
      iVar6 = uVar3 * 0x100;
      if (uVar3 < 0x1842) {
        uVar5 = iVar6 - 0x841eb;
      }
      else if (uVar3 < 0x5842) {
        uVar5 = iVar6 - 0x1841ea;
      }
      else {
        uVar5 = iVar6 - 0x5841e9;
      }
    }
  }
  *puVar19 = uVar5;
  memcpy(local_90,__src,(long)(int)uVar3);
  uVar5 = 0x40;
  iVar6 = (int)((long)__s1 - (long)__s2);
  if (local_94 != iVar6) {
    uVar4 = iVar6 + 3;
    uVar5 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    bVar10 = 0x1e - (char)(uVar5 ^ 0x1f);
    bVar21 = (uVar4 >> (bVar10 & 0x1f) & 1) != 0;
    uVar5 = ((uVar4 - (bVar21 + 2 << (bVar10 & 0x1f))) * 0x100 | (uVar5 ^ 0x1f) * 2 ^ 0x3e) +
            (uint)bVar21 + 0x4c;
    local_94 = iVar6;
  }
  puVar19[1] = uVar5;
  if (__n < 0xc) {
    puVar19[2] = (int)__n + 0x14;
    lStackY_b0 = 0xc;
  }
  else if (__n < 0x48) {
    uVar5 = 0x1f;
    uVar4 = (uint)(uVar16 - 2);
    if (uVar4 != 0) {
      for (; uVar4 >> uVar5 == 0; uVar5 = uVar5 - 1) {
      }
    }
    bVar10 = (char)(uVar5 ^ 0xffffffe0) + 0x1f;
    iVar6 = (int)(uVar16 - 2 >> (bVar10 & 0x3f));
    puVar19[2] = (uVar4 - (iVar6 << (bVar10 & 0x1f))) * 0x100 |
                 iVar6 + (uVar5 ^ 0xffffffe0) * 2 + 0x5a;
    lStackY_b0 = 0xc;
  }
  else {
    if (__n < 0x88) {
      puVar19[2] = ((uint)(uVar16 - 2) & 0x1f) << 8 | (int)(uVar16 - 2 >> 5) + 0x36U;
    }
    else {
      if (0x847 < __n) {
        puVar19[2] = (int)__n * 0x100 - 0x847c1;
        puVar19[3] = 0x40;
        lStackY_b0 = 0x10;
        goto LAB_00123ba6;
      }
      uVar5 = (int)uVar16 - 0x42;
      iVar6 = 0x1f;
      if (uVar5 != 0) {
        for (; uVar5 >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      puVar19[2] = ((int)(-1L << ((byte)iVar6 & 0x3f)) + (int)uVar16 + -0x42) * 0x100 + iVar6 + 0x34
      ;
    }
    puVar19[3] = 0x40;
    lStackY_b0 = 0x10;
  }
LAB_00123ba6:
  __src = (long *)((long)__s1 + uVar16 + 6);
  local_90 = local_90 + (int)uVar3;
  puVar19 = (uint *)((long)puVar19 + lStackY_b0);
  while( true ) {
    if ((long *)(uVar9 + (long)input_00) <= __src) goto LAB_00123e61;
    uVar11 = *(ulong *)((long)__src + -5);
    iVar2 = (int)__src - iVar7;
    table[uVar11 * 0x1e35a7bd0000 >> 0x34] = iVar2 + -5;
    table[(uVar11 >> 8) * 0x1e35a7bd0000 >> 0x34] = iVar2 + -4;
    table[(uVar11 >> 0x10) * 0x1e35a7bd0000 >> 0x34] = iVar2 + -3;
    uVar11 = *(ulong *)((long)__src + -2);
    uVar16 = (uVar11 >> 0x10) * 0x1e35a7bd0000 >> 0x34;
    table[uVar11 * 0x1e35a7bd0000 >> 0x34] = iVar2 + -2;
    table[(uVar11 >> 8) * 0x1e35a7bd0000 >> 0x34] = iVar2 + -1;
    iVar6 = table[uVar16];
    table[uVar16] = iVar2;
    __s2_00 = (int *)(input + iVar6);
    if ((((0x3fff0 < (long)__src - (long)__s2_00) || ((int)*__src != *__s2_00)) ||
        (*(char *)((long)__src + 4) != (char)__s2_00[1])) ||
       (*(char *)((long)__src + 5) != *(char *)((long)__s2_00 + 5))) break;
    uVar20 = (long)plVar8 + (-6 - (long)__src);
    uVar11 = uVar20 & 0xfffffffffffffff8;
    uVar16 = 0;
    lVar14 = 0;
LAB_00123ca9:
    if (uVar20 >> 3 == uVar16) {
      uVar17 = (ulong)((uint)uVar20 & 7);
      pcVar12 = (char *)((long)__src + (6 - lVar14));
      for (; (bVar21 = uVar17 != 0, uVar17 = uVar17 - 1, uVar16 = uVar20, bVar21 &&
             (uVar16 = uVar11, *(char *)((long)__s2_00 + uVar11 + 6) == *pcVar12));
          uVar11 = uVar11 + 1) {
        pcVar12 = pcVar12 + 1;
      }
    }
    else {
      uVar17 = *(ulong *)((long)__src + uVar16 * 8 + 6);
      uVar18 = *(ulong *)((long)__s2_00 + uVar16 * 8 + 6);
      if (uVar17 == uVar18) goto code_r0x00123cbf;
      uVar18 = uVar18 ^ uVar17;
      uVar11 = 0;
      if (uVar18 != 0) {
        for (; (uVar18 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
        }
      }
      uVar16 = (uVar11 >> 3 & 0x1fffffff) - lVar14;
    }
    uVar11 = uVar16 + 6;
    iVar6 = bcmp(__src,__s2_00,uVar11);
    if (iVar6 != 0) {
      __assert_fail("0 == memcmp(base, candidate, matched)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/brezza92[P]brotli/enc/compress_fragment_two_pass.c"
                    ,0x17a,
                    "void CreateCommands(const uint8_t *, size_t, size_t, const uint8_t *, int *, size_t, uint8_t **, uint32_t **)"
                   );
    }
    if (uVar11 < 10) {
      uVar5 = (int)uVar11 + 0x26;
    }
    else {
      uVar5 = (uint)uVar16;
      if (uVar11 < 0x86) {
        uVar3 = 0x1f;
        if (uVar5 != 0) {
          for (; uVar5 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        bVar10 = (char)(uVar3 ^ 0xffffffe0) + 0x1f;
        iVar6 = (int)(uVar16 >> (bVar10 & 0x3f));
        uVar5 = (uVar5 - (iVar6 << (bVar10 & 0x1f))) * 0x100 |
                iVar6 + (uVar3 ^ 0xffffffe0) * 2 + 0x6a;
      }
      else if (uVar11 < 0x846) {
        iVar6 = 0x1f;
        if (uVar5 - 0x40 != 0) {
          for (; uVar5 - 0x40 >> iVar6 == 0; iVar6 = iVar6 + -1) {
          }
        }
        uVar5 = iVar6 + ((int)(-1L << ((byte)iVar6 & 0x3f)) + uVar5 + -0x40) * 0x100 + 0x34;
      }
      else {
        uVar5 = (int)uVar11 * 0x100 - 0x845c1;
      }
    }
    local_94 = (int)((long)__src - (long)__s2_00);
    uVar4 = local_94 + 3;
    uVar3 = 0x1f;
    if (uVar4 != 0) {
      for (; uVar4 >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    bVar10 = 0x1e - (char)(uVar3 ^ 0x1f);
    bVar21 = (uVar4 >> (bVar10 & 0x1f) & 1) != 0;
    __src = (long *)((long)__src + uVar16 + 6);
    *puVar19 = uVar5;
    puVar19[1] = ((uVar4 - (bVar21 + 2 << (bVar10 & 0x1f))) * 0x100 | (uVar3 ^ 0x1f) * 2 ^ 0x3e) +
                 (uint)bVar21 + 0x4c;
    puVar19 = puVar19 + 2;
  }
  goto LAB_001238ad;
code_r0x001239c3:
  lVar14 = lVar14 + -8;
  uVar16 = uVar16 + 1;
  goto LAB_001239ac;
code_r0x00123cbf:
  lVar14 = lVar14 + -8;
  uVar16 = uVar16 + 1;
  goto LAB_00123ca9;
}

Assistant:

void BrotliCompressFragmentTwoPass(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, uint32_t* command_buf, uint8_t* literal_buf,
    int* table, size_t table_size, size_t* storage_ix, uint8_t* storage) {
  const size_t table_bits = Log2FloorNonZero(table_size);
  switch (table_bits) {
#define CASE_(B)                                      \
    case B:                                           \
      BrotliCompressFragmentTwoPassImpl ## B(         \
          m, input, input_size, is_last, command_buf, \
          literal_buf, table, storage_ix, storage);   \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: assert(0); break;
  }
}